

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe(char *source,char *dest,int compressedSize,int maxDecompressedSize)

{
  ushort *puVar1;
  BYTE *pBVar2;
  byte *pbVar3;
  byte bVar4;
  BYTE BVar5;
  undefined8 uVar6;
  ushort uVar7;
  ushort uVar8;
  U32 length;
  uint uVar9;
  int iVar10;
  ushort *puVar11;
  ulong uVar12;
  BYTE *pBVar13;
  char cVar14;
  uint uVar15;
  ushort *puVar16;
  ulong uVar17;
  BYTE *pBVar18;
  long lVar19;
  BYTE *pBVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  BYTE *d_2;
  BYTE *pBVar23;
  BYTE *unaff_R12;
  BYTE *d;
  BYTE *s;
  ushort *puVar24;
  ushort *puVar25;
  ulong uStack_80;
  int local_68;
  
  puVar11 = (ushort *)0xffffffffffffffff;
  if (source != (char *)0x0) {
    if (maxDecompressedSize == 0) {
      if (compressedSize == 1) {
        puVar11 = (ushort *)(ulong)-(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      puVar1 = (ushort *)(source + compressedSize);
      pBVar2 = (BYTE *)(dest + maxDecompressedSize);
      pBVar21 = (BYTE *)dest;
      puVar11 = (ushort *)source;
      if (maxDecompressedSize < 0x40) goto LAB_00102877;
      puVar16 = (ushort *)((long)puVar1 - 0xf);
      puVar24 = (ushort *)source;
LAB_001023f5:
      bVar4 = (byte)*puVar24;
      uVar9 = (uint)bVar4;
      puVar25 = (ushort *)((long)puVar24 + 1);
      uVar17 = (ulong)(uint)(bVar4 >> 4);
      puVar11 = puVar25;
      if (bVar4 >> 4 == 0xf) {
        uVar17 = 0xf;
        if (puVar25 < puVar16) {
          uVar15 = 0;
          do {
            uVar7 = *puVar11;
            puVar11 = (ushort *)((long)puVar11 + 1);
            uVar15 = uVar15 + (byte)uVar7;
          } while (puVar11 < puVar16 && (byte)uVar7 == 0xff);
          uVar17 = (ulong)uVar15 + 0xf;
        }
        pBVar20 = pBVar21 + uVar17;
        if (((puVar16 <= puVar25) || (CARRY8((ulong)pBVar21,uVar17))) ||
           (CARRY8((ulong)puVar11,uVar17))) {
          iVar10 = 5;
          pBVar20 = pBVar21;
        }
        else {
          unaff_R12 = pBVar20;
          if ((pBVar2 + -0x20 < pBVar20) || (puVar1 + -0x10 < (ushort *)((long)puVar11 + uVar17))) {
            iVar10 = 6;
            pBVar20 = pBVar21;
          }
          else {
            lVar19 = 0;
            do {
              uVar6 = *(undefined8 *)((byte *)((long)puVar11 + lVar19) + 8);
              pBVar18 = pBVar21 + lVar19;
              *(undefined8 *)pBVar18 = *(undefined8 *)((long)puVar11 + lVar19);
              *(undefined8 *)(pBVar18 + 8) = uVar6;
              pbVar3 = (byte *)((long)puVar11 + lVar19 + 0x10);
              uVar6 = *(undefined8 *)(pbVar3 + 8);
              *(undefined8 *)(pBVar18 + 0x10) = *(undefined8 *)pbVar3;
              *(undefined8 *)(pBVar18 + 0x18) = uVar6;
              lVar19 = lVar19 + 0x20;
            } while (pBVar18 + 0x20 < pBVar20);
            iVar10 = 0;
            puVar11 = (ushort *)((long)puVar11 + uVar17);
          }
        }
        if (iVar10 != 0) {
          if (iVar10 != 5) {
            pBVar21 = pBVar20;
            if (iVar10 == 6) goto LAB_00102777;
            goto LAB_00102932;
          }
          goto LAB_0010292a;
        }
      }
      else {
        pBVar20 = pBVar21 + uVar17;
        unaff_R12 = pBVar20;
        if ((ushort *)((long)puVar1 - 0x11U) < puVar25) goto LAB_00102777;
        uVar6 = *(undefined8 *)((long)puVar24 + 9);
        *(undefined8 *)pBVar21 = *(undefined8 *)puVar25;
        *(undefined8 *)(pBVar21 + 8) = uVar6;
        puVar11 = (ushort *)(uVar17 + (long)puVar25);
      }
      uVar7 = *puVar11;
      uVar12 = (ulong)uVar7;
      puVar11 = puVar11 + 1;
      pBVar18 = pBVar20 + -uVar12;
      uVar17 = (ulong)(bVar4 & 0xf);
      if (uVar17 == 0xf) {
        if (pBVar18 < dest) {
          iVar10 = 5;
          uStack_80 = 0xf;
        }
        else {
          uVar9 = 0;
          do {
            uVar8 = *puVar11;
            puVar11 = (ushort *)((long)puVar11 + 1);
            uVar9 = uVar9 + (byte)uVar8;
          } while ((byte)uVar8 == 0xff && puVar11 < puVar1 + -2);
          uVar17 = (ulong)uVar9;
          uStack_80 = uVar17 + 0xf;
          if ((puVar1 + -2 <= puVar11) || (CARRY8((ulong)pBVar20,uStack_80))) {
            iVar10 = 5;
          }
          else {
            uStack_80 = uVar17 + 0x13;
            iVar10 = 7;
            if (pBVar20 + uVar17 + 0x13 < pBVar2 + -0x40) {
              iVar10 = 0;
            }
          }
        }
        if (iVar10 != 0) {
          if (iVar10 != 5) {
            if (iVar10 != 7) goto LAB_00102932;
            goto LAB_00102819;
          }
          goto LAB_0010292a;
        }
LAB_00102586:
        if (pBVar18 < dest) goto LAB_0010292a;
        unaff_R12 = pBVar20 + uStack_80;
        pBVar21 = unaff_R12;
        puVar24 = puVar11;
        if (uVar7 < 0x10) {
          LZ4_memcpy_using_offset(pBVar20,pBVar18,unaff_R12,uVar12);
        }
        else {
          do {
            uVar6 = *(undefined8 *)(pBVar20 + -uVar12 + 8);
            *(undefined8 *)pBVar20 = *(undefined8 *)(pBVar20 + -uVar12);
            *(undefined8 *)(pBVar20 + 8) = uVar6;
            uVar6 = *(undefined8 *)(pBVar20 + -uVar12 + 0x10 + 8);
            *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)(pBVar20 + -uVar12 + 0x10);
            *(undefined8 *)(pBVar20 + 0x18) = uVar6;
            pBVar20 = pBVar20 + 0x20;
          } while (pBVar20 < unaff_R12);
        }
      }
      else {
        uStack_80 = uVar17 + 4;
        if (pBVar2 + -0x40 <= pBVar20 + uVar17 + 4) goto LAB_00102819;
        if ((pBVar18 < dest) || (uVar7 < 8)) goto LAB_00102586;
        *(undefined8 *)pBVar20 = *(undefined8 *)pBVar18;
        *(undefined8 *)(pBVar20 + 8) = *(undefined8 *)(pBVar18 + 8);
        *(undefined2 *)(pBVar20 + 0x10) = *(undefined2 *)(pBVar18 + 0x10);
        pBVar21 = pBVar20 + uVar17 + 4;
        puVar24 = puVar11;
      }
      goto LAB_001023f5;
    }
  }
LAB_00102932:
  return (int)puVar11;
LAB_00102819:
  if (pBVar18 < dest) goto LAB_0010292a;
  pBVar21 = pBVar20 + uStack_80;
  if ((uint)uVar12 < 8) {
    pBVar20[0] = '\0';
    pBVar20[1] = '\0';
    pBVar20[2] = '\0';
    pBVar20[3] = '\0';
    *pBVar20 = *pBVar18;
    pBVar20[1] = pBVar18[1];
    pBVar20[2] = pBVar18[2];
    pBVar20[3] = pBVar18[3];
    uVar17 = (ulong)((uint)uVar12 << 2);
    uVar12 = (ulong)*(uint *)((long)inc32table + uVar17);
    *(undefined4 *)(pBVar20 + 4) = *(undefined4 *)(pBVar18 + uVar12);
    pBVar18 = pBVar18 + (uVar12 - (long)*(int *)((long)dec64table + uVar17));
  }
  else {
    *(undefined8 *)pBVar20 = *(undefined8 *)pBVar18;
    pBVar18 = pBVar18 + 8;
  }
  pBVar13 = pBVar20 + 8;
  if (pBVar2 + -0xc < pBVar21) {
    iVar10 = 5;
    if (pBVar21 <= pBVar2 + -5) {
      pBVar20 = pBVar2 + -7;
      pBVar22 = pBVar18;
      pBVar23 = pBVar13;
      if (pBVar13 < pBVar20) {
        do {
          *(undefined8 *)pBVar23 = *(undefined8 *)pBVar22;
          pBVar23 = pBVar23 + 8;
          pBVar22 = pBVar22 + 8;
        } while (pBVar23 < pBVar20);
        pBVar18 = pBVar18 + ((long)pBVar20 - (long)pBVar13);
        pBVar13 = pBVar20;
      }
      iVar10 = 0;
      for (; pBVar13 < pBVar21; pBVar13 = pBVar13 + 1) {
        BVar5 = *pBVar18;
        pBVar18 = pBVar18 + 1;
        *pBVar13 = BVar5;
      }
    }
    if (iVar10 != 0) {
      if (iVar10 != 5) goto LAB_00102932;
      goto LAB_0010292a;
    }
  }
  else {
    *(undefined8 *)pBVar13 = *(undefined8 *)pBVar18;
    if (0x10 < uStack_80) {
      pBVar20 = pBVar20 + 0x10;
      do {
        pBVar18 = pBVar18 + 8;
        *(undefined8 *)pBVar20 = *(undefined8 *)pBVar18;
        pBVar20 = pBVar20 + 8;
      } while (pBVar20 < pBVar21);
    }
  }
LAB_00102877:
  bVar4 = (byte)*puVar11;
  puVar16 = (ushort *)((long)puVar11 + 1);
  while( true ) {
    uVar9 = (uint)bVar4;
    if (bVar4 >> 4 == 0xf) break;
    uVar17 = (ulong)(uint)(bVar4 >> 4);
    if ((source + (long)compressedSize + -0x10 <= puVar16) ||
       (dest + (long)maxDecompressedSize + -0x20 < pBVar21)) goto LAB_00102771;
    uVar6 = *(undefined8 *)(puVar16 + 4);
    *(undefined8 *)pBVar21 = *(undefined8 *)puVar16;
    *(undefined8 *)(pBVar21 + 8) = uVar6;
    unaff_R12 = pBVar21 + uVar17;
    uStack_80 = (ulong)(uVar9 & 0xf);
    puVar11 = (ushort *)((long)puVar16 + uVar17) + 1;
    uVar7 = *(ushort *)((long)puVar16 + uVar17);
    uVar12 = (ulong)uVar7;
    pBVar18 = unaff_R12 + -uVar12;
    if ((((uVar9 & 0xf) == 0xf) || (uVar7 < 8)) || (pBVar18 < dest)) goto LAB_001027bc;
    *(undefined8 *)unaff_R12 = *(undefined8 *)pBVar18;
    *(undefined8 *)(unaff_R12 + 8) = *(undefined8 *)(pBVar18 + 8);
    *(undefined2 *)(unaff_R12 + 0x10) = *(undefined2 *)(pBVar18 + 0x10);
    pBVar21 = unaff_R12 + uStack_80 + 4;
    bVar4 = *(byte *)((long)puVar16 + uVar17 + 2);
    puVar16 = (ushort *)((long)puVar16 + uVar17 + 3);
  }
  puVar24 = (ushort *)((long)puVar1 - 0xf);
  uVar17 = 0xf;
  puVar11 = puVar16;
  if (puVar16 < puVar24) {
    uVar15 = 0;
    do {
      uVar7 = *puVar11;
      puVar11 = (ushort *)((long)puVar11 + 1);
      uVar15 = uVar15 + (byte)uVar7;
    } while (puVar11 < puVar24 && (byte)uVar7 == 0xff);
    uVar17 = (ulong)uVar15 + 0xf;
  }
  if (((puVar24 <= puVar16) || (CARRY8((ulong)pBVar21,uVar17))) ||
     (puVar16 = puVar11, CARRY8((ulong)puVar11,uVar17))) goto LAB_0010292a;
LAB_00102771:
  unaff_R12 = pBVar21 + uVar17;
  puVar11 = puVar16;
LAB_00102777:
  puVar16 = (ushort *)((long)puVar11 + uVar17);
  if ((pBVar2 + -0xc < unaff_R12) || (puVar1 + -4 < puVar16)) {
    if ((puVar16 == puVar1) && (unaff_R12 <= pBVar2)) {
      memmove(pBVar21,puVar11,uVar17);
      puVar11 = (ushort *)(ulong)(uint)(((int)pBVar21 + (int)uVar17) - (int)dest);
      goto LAB_00102932;
    }
    goto LAB_0010292a;
  }
  do {
    *(undefined8 *)pBVar21 = *(undefined8 *)puVar11;
    pBVar21 = pBVar21 + 8;
    puVar11 = puVar11 + 4;
  } while (pBVar21 < unaff_R12);
  uVar12 = (ulong)*puVar16;
  puVar11 = puVar16 + 1;
  pBVar18 = unaff_R12 + -uVar12;
  uStack_80 = (ulong)(uVar9 & 0xf);
LAB_001027bc:
  if ((int)uStack_80 == 0xf) {
    uVar9 = 0;
    do {
      uVar7 = *puVar11;
      puVar11 = (ushort *)((long)puVar11 + 1);
      uVar9 = uVar9 + (byte)uVar7;
    } while (puVar11 < puVar1 + -2 && (byte)uVar7 == 0xff);
    uStack_80 = (ulong)uVar9 + 0xf;
    cVar14 = '\x05';
    if (puVar11 < puVar1 + -2) {
      cVar14 = CARRY8((ulong)unaff_R12,uStack_80) * '\x05';
    }
    if (cVar14 != '\0') {
      if (cVar14 != '\x05') goto LAB_00102932;
      goto LAB_0010292a;
    }
  }
  uStack_80 = uStack_80 + 4;
  pBVar20 = unaff_R12;
  goto LAB_00102819;
LAB_0010292a:
  local_68 = (int)source;
  puVar11 = (ushort *)(ulong)(~(uint)puVar11 + local_68);
  goto LAB_00102932;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
int LZ4_decompress_safe(const char* source, char* dest, int compressedSize, int maxDecompressedSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxDecompressedSize,
                                  endOnInputSize, decode_full_block, noDict,
                                  (BYTE*)dest, NULL, 0);
}